

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_28939b::ArgParser::argVersion(ArgParser *this)

{
  element_type *peVar1;
  element_type *this_00;
  Pipeline *pPVar2;
  Pipeline *this_01;
  string *str;
  shared_ptr<QPDFLogger> local_50;
  QPDFLogger local_40;
  undefined1 local_30 [8];
  string whoami;
  ArgParser *this_local;
  
  whoami.field_2._8_8_ = this;
  QPDFArgParser::getProgname_abi_cxx11_((string *)local_30,&this->ap);
  QPDFLogger::defaultLogger();
  peVar1 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_50);
  QPDFLogger::getInfo(&local_40,SUB81(peVar1,0));
  this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_40);
  pPVar2 = Pipeline::operator<<(this_00,(string *)local_30);
  this_01 = Pipeline::operator<<(pPVar2," version ");
  str = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)pPVar2);
  pPVar2 = Pipeline::operator<<(this_01,str);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"Run ");
  pPVar2 = Pipeline::operator<<(pPVar2,(string *)local_30);
  Pipeline::operator<<(pPVar2," --copyright to see copyright and license information.\n");
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_40);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_50);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void
ArgParser::argVersion()
{
    auto whoami = this->ap.getProgname();
    *QPDFLogger::defaultLogger()->getInfo()
        << whoami << " version " << QPDF::QPDFVersion() << "\n"
        << "Run " << whoami << " --copyright to see copyright and license information.\n";
}